

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateParseFromMethods
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *in_RDX;
  string local_30;
  
  ClassName_abi_cxx11_(&local_30,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "public static $classname$ parseFrom(\n    com.google.protobuf.ByteString data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return PARSER.parseFrom(data);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.ByteString data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return PARSER.parseFrom(data, extensionRegistry);\n}\npublic static $classname$ parseFrom(byte[] data)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return PARSER.parseFrom(data);\n}\npublic static $classname$ parseFrom(\n    byte[] data,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  return PARSER.parseFrom(data, extensionRegistry);\n}\npublic static $classname$ parseFrom(java.io.InputStream input)\n    throws java.io.IOException {\n  return PARSER.parseFrom(input);\n}\npublic static $classname$ parseFrom(\n    java.io.InputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  return PARSER.parseFrom(input, extensionRegistry);\n}\npublic static $classname$ parseDelimitedFrom(java.io.InputStream input)\n    throws java.io.IOException {\n  return PARSER.parseDelimitedFrom(input);\n}\npublic static $classname$ parseDelimitedFrom(\n    java.io.InputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  return PARSER.parseDelimitedFrom(input, extensionRegistry);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.CodedInputStream input)\n    throws java.io.IOException {\n  return PARSER.parseFrom(input);\n}\npublic static $classname$ parseFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws java.io.IOException {\n  return PARSER.parseFrom(input, extensionRegistry);\n}\n\n"
                     ,"classname",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MessageGenerator::
GenerateParseFromMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  printer->Print(
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.ByteString data)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return PARSER.parseFrom(data);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.ByteString data,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return PARSER.parseFrom(data, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(byte[] data)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return PARSER.parseFrom(data);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    byte[] data,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  return PARSER.parseFrom(data, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(java.io.InputStream input)\n"
    "    throws java.io.IOException {\n"
    "  return PARSER.parseFrom(input);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    java.io.InputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  return PARSER.parseFrom(input, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseDelimitedFrom(java.io.InputStream input)\n"
    "    throws java.io.IOException {\n"
    "  return PARSER.parseDelimitedFrom(input);\n"
    "}\n"
    "public static $classname$ parseDelimitedFrom(\n"
    "    java.io.InputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  return PARSER.parseDelimitedFrom(input, extensionRegistry);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.CodedInputStream input)\n"
    "    throws java.io.IOException {\n"
    "  return PARSER.parseFrom(input);\n"
    "}\n"
    "public static $classname$ parseFrom(\n"
    "    com.google.protobuf.CodedInputStream input,\n"
    "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
    "    throws java.io.IOException {\n"
    "  return PARSER.parseFrom(input, extensionRegistry);\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));
}